

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall ON_Annotation::ON_Annotation(ON_Annotation *this,ON_Annotation *src)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_UUID *pOVar11;
  ON_Annotation *src_local;
  ON_Annotation *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry,&src->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b67ac8;
  this->m_annotation_type = Unset;
  this->m_allow_text_scaling = true;
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_reserved4 = 0;
  pOVar11 = ON_ModelComponent::Id(&ON_DimStyle::Default.super_ON_ModelComponent);
  uVar2 = pOVar11->Data2;
  uVar3 = pOVar11->Data3;
  uVar1 = *(undefined8 *)pOVar11->Data4;
  (this->m_dimstyle_id).Data1 = pOVar11->Data1;
  (this->m_dimstyle_id).Data2 = uVar2;
  (this->m_dimstyle_id).Data3 = uVar3;
  *(undefined8 *)(this->m_dimstyle_id).Data4 = uVar1;
  dVar4 = ON_Plane::World_xy.plane_equation.d;
  (this->m_plane).plane_equation.z = ON_Plane::World_xy.plane_equation.z;
  (this->m_plane).plane_equation.d = dVar4;
  dVar4 = ON_Plane::World_xy.plane_equation.y;
  (this->m_plane).plane_equation.x = ON_Plane::World_xy.plane_equation.x;
  (this->m_plane).plane_equation.y = dVar4;
  dVar4 = ON_Plane::World_xy.zaxis.z;
  (this->m_plane).zaxis.y = ON_Plane::World_xy.zaxis.y;
  (this->m_plane).zaxis.z = dVar4;
  dVar4 = ON_Plane::World_xy.zaxis.x;
  (this->m_plane).yaxis.z = ON_Plane::World_xy.yaxis.z;
  (this->m_plane).zaxis.x = dVar4;
  dVar10 = ON_Plane::World_xy.yaxis.y;
  dVar9 = ON_Plane::World_xy.xaxis.z;
  dVar8 = ON_Plane::World_xy.xaxis.y;
  dVar7 = ON_Plane::World_xy.xaxis.x;
  dVar6 = ON_Plane::World_xy.origin.z;
  dVar5 = ON_Plane::World_xy.origin.y;
  dVar4 = ON_Plane::World_xy.origin.x;
  (this->m_plane).yaxis.x = ON_Plane::World_xy.yaxis.x;
  (this->m_plane).yaxis.y = dVar10;
  (this->m_plane).xaxis.y = dVar8;
  (this->m_plane).xaxis.z = dVar9;
  (this->m_plane).origin.z = dVar6;
  (this->m_plane).xaxis.x = dVar7;
  (this->m_plane).origin.x = dVar4;
  (this->m_plane).origin.y = dVar5;
  dVar4 = ON_2dVector::XAxis.y;
  (this->m_horizontal_direction).x = ON_2dVector::XAxis.x;
  (this->m_horizontal_direction).y = dVar4;
  this->m_text = (ON_TextContent *)0x0;
  this->m_override_dimstyle = (ON_DimStyle *)0x0;
  this->m_parent_dimstyle_content_version_number = 0;
  ON_BoundingBoxCache::ON_BoundingBoxCache(&this->m_bbox_cache);
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Annotation::ON_Annotation(const ON_Annotation& src)
  : ON_Geometry(src)
{
  Internal_CopyFrom(src);
}